

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

string * __thiscall
SslTcpSocketImpl::GetSelAlpnProtocol_abi_cxx11_
          (string *__return_storage_ptr__,SslTcpSocketImpl *this)

{
  SslConnection *this_00;
  
  this_00 = (this->m_pSslCon)._M_t.
            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            ._M_t.
            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  if (this_00 == (SslConnection *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    OpenSSLWrapper::SslConnection::GetSelAlpnProtocol_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

const string SslTcpSocketImpl::GetSelAlpnProtocol() const
{
    if (m_pSslCon != nullptr)
        return m_pSslCon->GetSelAlpnProtocol();
    return string();
}